

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O0

HPDF_INT HPDF_MemCmp(HPDF_BYTE *s1,HPDF_BYTE *s2,HPDF_UINT n)

{
  HPDF_UINT local_24;
  byte *pbStack_20;
  HPDF_UINT n_local;
  HPDF_BYTE *s2_local;
  HPDF_BYTE *s1_local;
  
  local_24 = n;
  pbStack_20 = s2;
  s2_local = s1;
  if (n == 0) {
    s1_local._4_4_ = 0;
  }
  else {
    for (; *s2_local == *pbStack_20; s2_local = s2_local + 1) {
      local_24 = local_24 - 1;
      if (local_24 == 0) {
        return 0;
      }
      pbStack_20 = pbStack_20 + 1;
    }
    s1_local._4_4_ = (uint)*s2_local - (uint)*pbStack_20;
  }
  return s1_local._4_4_;
}

Assistant:

HPDF_INT
HPDF_MemCmp  (const HPDF_BYTE   *s1,
              const HPDF_BYTE   *s2,
              HPDF_UINT          n)
{
    if (n == 0)
        return 0;

    while (*s1 == *s2) {
        n--;
        if (n == 0)
            return 0;
        s1++;
        s2++;
    }

    return *s1 - *s2;
}